

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O3

void __thiscall randomx::JitCompilerX86::h_IXOR_M(JitCompilerX86 *this,Instruction *instr,int i)

{
  byte bVar1;
  uint8_t *puVar2;
  int iVar3;
  int iVar4;
  
  bVar1 = instr->dst;
  this->registerUsage[bVar1] = i;
  if (instr->src == bVar1) {
    puVar2 = this->code;
    iVar3 = this->codePos;
    (puVar2 + iVar3)[0] = 'L';
    (puVar2 + iVar3)[1] = '3';
    iVar3 = this->codePos + 2;
    this->codePos = iVar3;
    this->code[iVar3] = instr->dst * '\b' + 0x86;
    iVar3 = this->codePos;
    this->codePos = iVar3 + 1;
    *(uint32_t *)(this->code + (long)iVar3 + 1) = instr->imm32 & 0x1ffff8;
    iVar4 = 4;
  }
  else {
    iVar4 = 1;
    genAddressReg(this,instr,true);
    puVar2 = this->code;
    iVar3 = this->codePos;
    (puVar2 + iVar3)[0] = 'L';
    (puVar2 + iVar3)[1] = '3';
    iVar3 = this->codePos + 2;
    this->codePos = iVar3;
    this->code[iVar3] = instr->dst << 3 | 4;
    iVar3 = this->codePos;
    this->codePos = iVar3 + 1;
    this->code[(long)iVar3 + 1] = '\x06';
  }
  this->codePos = this->codePos + iVar4;
  return;
}

Assistant:

void JitCompilerX86::h_IXOR_M(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if (instr.src != instr.dst) {
			genAddressReg(instr);
			emit(REX_XOR_RM);
			emitByte(0x04 + 8 * instr.dst);
			emitByte(0x06);
		}
		else {
			emit(REX_XOR_RM);
			emitByte(0x86 + 8 * instr.dst);
			genAddressImm(instr);
		}
	}